

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *spacePadPositive,int *ntrunc,char *fmtStart,
                 FormatArg *formatters,int *argIndex,int numFormatters)

{
  _func_int **pp_Var1;
  code cVar2;
  byte bVar3;
  int iVar4;
  _func_int *p_Var5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  long local_40;
  
  if (*fmtStart != '%') {
    __assert_fail("0 && \"tinyformat: Not enough conversion specifiers in format string\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                  ,0x259,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  pp_Var1 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var1[-3]) = 0;
  *(undefined8 *)(&out->field_0x8 + (long)pp_Var1[-3]) = 6;
  p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var1[-3]);
  if ((&out->field_0xe1)[(long)pp_Var1[-3]] == '\0') {
    cVar2 = (code)std::ios::widen((char)p_Var5);
    p_Var5[0xe0] = cVar2;
    p_Var5[0xe1] = (code)0x1;
  }
  p_Var5[0xe0] = (code)0x20;
  *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
       *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffb000;
  local_40 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        fmtStart = (char *)((byte *)fmtStart + 1);
        bVar3 = *fmtStart;
        if (bVar3 < 0x2b) break;
        if (bVar3 == 0x2d) {
          p_Var5 = (_func_int *)
                   ((long)&out->_vptr_basic_ostream + (long)out->_vptr_basic_ostream[-3]);
          if ((&out->field_0xe1)[(long)out->_vptr_basic_ostream[-3]] == '\0') {
            cVar2 = (code)std::ios::widen((char)p_Var5);
            p_Var5[0xe0] = cVar2;
            p_Var5[0xe1] = (code)0x1;
          }
          p_Var5[0xe0] = (code)0x20;
          *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
               *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x20;
        }
        else if (bVar3 == 0x30) {
          if (((&out->field_0x18)[(long)out->_vptr_basic_ostream[-3]] & 0x20) == 0) {
            p_Var5 = (_func_int *)
                     ((long)&out->_vptr_basic_ostream + (long)out->_vptr_basic_ostream[-3]);
            if (p_Var5[0xe1] == (_func_int)0x0) {
              cVar2 = (code)std::ios::widen((char)p_Var5);
              p_Var5[0xe0] = cVar2;
              p_Var5[0xe1] = (code)0x1;
            }
            p_Var5[0xe0] = (code)0x30;
            *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
                 *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffff4f |
                 0x10;
          }
        }
        else {
          if (bVar3 != 0x2b) goto LAB_00124b4a;
          *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
               *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x800;
          *spacePadPositive = false;
          local_40 = 1;
        }
      }
      if (bVar3 != 0x20) break;
      if (((&out->field_0x19)[(long)out->_vptr_basic_ostream[-3]] & 8) == 0) {
        *spacePadPositive = true;
      }
    }
    if (bVar3 != 0x23) break;
    *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
         *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x600;
  }
LAB_00124b4a:
  bVar11 = (byte)(bVar3 - 0x30) < 10;
  if (bVar11) {
    uVar8 = 0;
    if ((byte)(bVar3 - 0x30) < 10) {
      do {
        uVar7 = (uint)(byte)(bVar3 - 0x30) + (int)uVar8 * 10;
        uVar8 = (ulong)uVar7;
        bVar3 = ((byte *)fmtStart)[1];
        fmtStart = (char *)((byte *)fmtStart + 1);
      } while ((byte)(bVar3 - 0x30) < 10);
      uVar8 = (ulong)(int)uVar7;
    }
    *(ulong *)(&out->field_0x10 + (long)out->_vptr_basic_ostream[-3]) = uVar8;
  }
  if (*fmtStart == 0x2a) {
    iVar4 = *argIndex;
    if (numFormatters <= iVar4) {
      __assert_fail("0 && \"tinyformat: Not enough arguments to read variable width\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                    ,0x29a,
                    "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                   );
    }
    *argIndex = iVar4 + 1;
    uVar7 = FormatArg::toInt(formatters + iVar4);
    if ((int)uVar7 < 0) {
      p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)out->_vptr_basic_ostream[-3]);
      if ((&out->field_0xe1)[(long)out->_vptr_basic_ostream[-3]] == '\0') {
        cVar2 = (code)std::ios::widen((char)p_Var5);
        p_Var5[0xe0] = cVar2;
        p_Var5[0xe1] = (code)0x1;
      }
      p_Var5[0xe0] = (code)0x20;
      *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
           *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x20;
      uVar7 = -uVar7;
    }
    *(ulong *)(&out->field_0x10 + (long)out->_vptr_basic_ostream[-3]) = (ulong)uVar7;
    fmtStart = (char *)((byte *)fmtStart + 1);
    bVar11 = true;
  }
  bVar3 = *fmtStart;
  pbVar9 = (byte *)fmtStart;
  if (bVar3 == 0x2e) {
    bVar6 = ((byte *)fmtStart)[1];
    if (bVar6 == 0x2a) {
      iVar4 = *argIndex;
      if (numFormatters <= iVar4) {
        __assert_fail("0 && \"tinyformat: Not enough arguments to read variable precision\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x2b0,
                      "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                     );
      }
      pbVar9 = (byte *)fmtStart + 2;
      *argIndex = iVar4 + 1;
      iVar4 = FormatArg::toInt(formatters + iVar4);
    }
    else {
      pbVar9 = (byte *)fmtStart + 1;
      iVar4 = 0;
      if ((byte)(bVar6 - 0x30) < 10) {
        iVar4 = 0;
        if ((byte)(bVar6 - 0x30) < 10) {
          iVar4 = 0;
          do {
            iVar4 = (uint)(byte)(bVar6 - 0x30) + iVar4 * 10;
            bVar6 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
          } while ((byte)(bVar6 - 0x30) < 10);
        }
      }
      else if (bVar6 == 0x2d) {
        pbVar9 = (byte *)fmtStart + 2;
        bVar6 = ((byte *)fmtStart)[2];
        while ((byte)(bVar6 - 0x30) < 10) {
          pbVar10 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
          bVar6 = *pbVar10;
        }
      }
    }
    *(long *)(&out->field_0x8 + (long)out->_vptr_basic_ostream[-3]) = (long)iVar4;
  }
LAB_00124c7f:
  pbVar10 = pbVar9 + 1;
  bVar6 = *pbVar9;
  uVar7 = 8;
  switch(bVar6) {
  case 0x45:
    *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
         *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x4000;
  case 0x65:
    pp_Var1 = out->_vptr_basic_ostream;
    p_Var5 = pp_Var1[-3];
    *(uint *)(&out->field_0x18 + (long)p_Var5) =
         *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xfffffefb | 0x100;
    p_Var5 = pp_Var1[-3];
    uVar7 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xffffffb5 | 2;
LAB_00124de2:
    *(uint *)(&out->field_0x18 + (long)p_Var5) = uVar7;
    return (char *)pbVar10;
  case 0x46:
    *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
         *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x4000;
  case 0x66:
    p_Var5 = out->_vptr_basic_ostream[-3];
    uVar7 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xfffffefb | 4;
    goto LAB_00124de2;
  case 0x47:
    *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
         *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x4000;
  case 0x67:
    pp_Var1 = out->_vptr_basic_ostream;
    p_Var5 = pp_Var1[-3];
    *(uint *)(&out->field_0x18 + (long)p_Var5) =
         *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xffffffb5 | 2;
    *(uint *)(&out->field_0x18 + (long)pp_Var1[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var1[-3]) & 0xfffffefb;
    return (char *)pbVar10;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 99:
  case 0x6b:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x76:
  case 0x77:
  case 0x79:
    return (char *)pbVar10;
  case 0x4c:
  case 0x68:
  case 0x6a:
  case 0x6c:
  case 0x74:
  case 0x7a:
    goto switchD_00124c9c_caseD_4c;
  case 0x58:
    *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
         *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x4000;
    break;
  case 100:
  case 0x69:
  case 0x75:
    uVar7 = 2;
    break;
  case 0x6e:
    __assert_fail("0 && \"tinyformat: %n conversion spec not supported\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                  ,0x2f9,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  case 0x6f:
    uVar7 = 0x40;
    break;
  case 0x70:
  case 0x78:
    break;
  case 0x73:
    if (bVar3 == 0x2e) {
      *ntrunc = *(int *)(&out->field_0x8 + (long)out->_vptr_basic_ostream[-3]);
    }
    *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
         *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 1;
    return (char *)pbVar10;
  default:
    if (bVar6 == 0) {
      __assert_fail("0 && \"tinyformat: Conversion spec incorrectly \" \"terminated by end of string\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                    ,0x2fd,
                    "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                   );
    }
    if (bVar6 != 0x41) {
      return (char *)pbVar10;
    }
  case 0x61:
    __assert_fail("0 && \"tinyformat: the %a and %A conversion specs \" \"are not supported\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                  ,0x2ec,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
       *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffffb5 | uVar7;
  if ((bool)(bVar11 | bVar3 != 0x2e)) {
    return (char *)pbVar10;
  }
  pp_Var1 = out->_vptr_basic_ostream;
  *(long *)(&out->field_0x10 + (long)pp_Var1[-3]) =
       local_40 + *(long *)(&out->field_0x8 + (long)pp_Var1[-3]);
  *(uint *)(&out->field_0x18 + (long)pp_Var1[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var1[-3]) & 0xffffff4f | 0x10;
  p_Var5 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var1[-3]);
  if ((&out->field_0xe1)[(long)pp_Var1[-3]] == '\0') {
    cVar2 = (code)std::ios::widen((char)p_Var5);
    p_Var5[0xe0] = cVar2;
    p_Var5[0xe1] = (code)0x1;
  }
  p_Var5[0xe0] = (code)0x30;
  return (char *)pbVar10;
switchD_00124c9c_caseD_4c:
  pbVar9 = pbVar10;
  goto LAB_00124c7f;
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* formatters,
                                         int& argIndex, int numFormatters)
{
    if(*fmtStart != '%')
    {
        TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
        return fmtStart;
    }
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;
    // 1) Parse flags
    for(;; ++c)
    {
        switch(*c)
        {
            case '#':
                out.setf(std::ios::showpoint | std::ios::showbase);
                continue;
            case '0':
                // overridden by left alignment ('-' flag)
                if(!(out.flags() & std::ios::left))
                {
                    // Use internal padding so that numeric values are
                    // formatted correctly, eg -00010 rather than 000-10
                    out.fill('0');
                    out.setf(std::ios::internal, std::ios::adjustfield);
                }
                continue;
            case '-':
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                continue;
            case ' ':
                // overridden by show positive sign, '+' flag.
                if(!(out.flags() & std::ios::showpos))
                    spacePadPositive = true;
                continue;
            case '+':
                out.setf(std::ios::showpos);
                spacePadPositive = false;
                widthExtra = 1;
                continue;
            default:
                break;
        }
        break;
    }
    // 2) Parse width
    if(*c >= '0' && *c <= '9')
    {
        widthSet = true;
        out.width(parseIntAndAdvance(c));
    }
    if(*c == '*')
    {
        widthSet = true;
        int width = 0;
        if(argIndex < numFormatters)
            width = formatters[argIndex++].toInt();
        else
            TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width");
        if(width < 0)
        {
            // negative widths correspond to '-' flag set
            out.fill(' ');
            out.setf(std::ios::left, std::ios::adjustfield);
            width = -width;
        }
        out.width(width);
        ++c;
    }
    // 3) Parse precision
    if(*c == '.')
    {
        ++c;
        int precision = 0;
        if(*c == '*')
        {
            ++c;
            if(argIndex < numFormatters)
                precision = formatters[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable precision");
        }
        else
        {
            if(*c >= '0' && *c <= '9')
                precision = parseIntAndAdvance(c);
            else if(*c == '-') // negative precisions ignored, treated as zero.
                parseIntAndAdvance(++c);
        }
        out.precision(precision);
        precisionSet = true;
    }
    // 4) Ignore any C99 length modifier
    while(*c == 'l' || *c == 'h' || *c == 'L' ||
          *c == 'j' || *c == 'z' || *c == 't')
        ++c;
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch(*c)
    {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'a': case 'A':
            TINYFORMAT_ERROR("tinyformat: the %a and %A conversion specs "
                             "are not supported");
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if(precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if(intConversion && precisionSet && !widthSet)
    {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}